

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O2

void __thiscall gui::MultilineTextBox::setSizeWithinBounds(MultilineTextBox *this,Vector2f *size)

{
  float *pfVar1;
  element_type *peVar2;
  TextBoxStyle *this_00;
  uint uVar3;
  float fVar4;
  float fVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar6;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  FloatRect FVar7;
  locale local_70 [8];
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_68
  ;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  peVar2 = (this->style_).super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::locale::locale(local_70);
  sf::String::String((String *)&local_68,"A",local_70);
  sf::Text::setString(&(peVar2->super_TextBoxStyle).text_,(String *)&local_68);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&local_68);
  std::locale::~locale(local_70);
  FVar7 = sf::Text::getLocalBounds
                    (&(((this->style_).
                        super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_TextBoxStyle).text_);
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = FVar7._0_8_;
  local_48._12_4_ = extraout_XMM0_Dd;
  local_38._8_4_ = in_XMM1_Dc;
  local_38._0_8_ = FVar7._8_8_;
  local_38._12_4_ = in_XMM1_Dd;
  peVar2 = (this->style_).super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::locale::locale(local_70);
  sf::String::String((String *)&local_68,"AA",local_70);
  sf::Text::setString(&(peVar2->super_TextBoxStyle).text_,(String *)&local_68);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&local_68);
  std::locale::~locale(local_70);
  FVar7 = sf::Text::getLocalBounds
                    (&(((this->style_).
                        super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_TextBoxStyle).text_);
  fVar5 = size->x;
  if ((fVar5 != (this->size_).x) || (NAN(fVar5) || NAN((this->size_).x))) {
    fVar4 = (FVar7.left + FVar7.width) - ((float)local_38._0_4_ + (float)local_48._0_4_);
    fVar6 = (((this->style_).
              super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_TextBoxStyle).textPadding_.x;
    fVar4 = (((fVar5 - (fVar6 + fVar6)) - ((float)local_38._0_4_ + (float)local_48._0_4_)) + fVar4)
            / fVar4;
    fVar5 = 0.0;
    if (0.0 <= fVar4) {
      fVar5 = fVar4;
    }
    local_68._M_dataplus._M_p =
         (pointer)((long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f | (long)fVar5);
  }
  else {
    local_68._M_dataplus._M_p = (pointer)(this->sizeCharacters_).x;
  }
  fVar5 = size->y;
  pfVar1 = &(this->size_).y;
  if ((fVar5 != *pfVar1) || (NAN(fVar5) || NAN(*pfVar1))) {
    this_00 = &((this->style_).
                super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_TextBoxStyle;
    fVar6 = (this_00->textPadding_).y;
    local_38._0_4_ = (this_00->textPadding_).z;
    local_48._0_4_ = fVar5 - (fVar6 + fVar6);
    uVar3 = TextBoxStyle::getCharacterSize(this_00);
    fVar6 = (float)local_48._0_4_ / ((float)uVar3 * (float)local_38._0_4_);
    fVar5 = 0.0;
    if (0.0 <= fVar6) {
      fVar5 = fVar6;
    }
    local_68._M_string_length = (long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f | (long)fVar5;
  }
  else {
    local_68._M_string_length = (this->sizeCharacters_).y;
  }
  setSizeCharacters(this,(Vector2<unsigned_long> *)&local_68);
  return;
}

Assistant:

void MultilineTextBox::setSizeWithinBounds(const sf::Vector2f& size) {
    style_->text_.setString("A");
    const auto bounds1 = style_->text_.getLocalBounds();
    style_->text_.setString("AA");
    const auto bounds2 = style_->text_.getLocalBounds();

    // The first character may have some extra spacing, so figure out the actual width of each one.
    const auto charWidthFirst = bounds1.left + bounds1.width;
    const auto charWidth = bounds2.left + bounds2.width - charWidthFirst;

    sf::Vector2<size_t> sizeCharacters;
    if (size.x == size_.x) {
        sizeCharacters.x = sizeCharacters_.x;
    } else {
        sizeCharacters.x = static_cast<size_t>(std::max((size.x - 2.0f * style_->textPadding_.x - charWidthFirst + charWidth) / charWidth, 0.0f));
    }
    if (size.y == size_.y) {
        sizeCharacters.y = sizeCharacters_.y;
    } else {
        sizeCharacters.y = static_cast<size_t>(std::max((size.y - 2.0f * style_->textPadding_.y) / (style_->textPadding_.z * style_->getCharacterSize()), 0.0f));
    }
    setSizeCharacters(sizeCharacters);
}